

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPetNet.cpp
# Opt level: O0

void NaPetriNet::user_break(int signum)

{
  sigaction sa_old;
  sigaction sa;
  sigaction sStack_138;
  sigaction local_a0;
  
  bUserBreak = true;
  local_a0.__sigaction_handler.sa_handler = user_break;
  local_a0.sa_flags = -0x80000000;
  sigaction(2,&local_a0,&sStack_138);
  sigaction(0xf,&local_a0,&sStack_138);
  sigaction(3,&local_a0,&sStack_138);
  return;
}

Assistant:

void
NaPetriNet::user_break (int signum)
{
    bUserBreak = true;

    // Repeat register the signal handler oncve again
    struct sigaction	sa, sa_old;
    sa.sa_handler = user_break;
    sa.sa_flags = SA_ONESHOT;
    sigaction(SIGINT, &sa, &sa_old);
    sigaction(SIGTERM, &sa, &sa_old);
    sigaction(SIGQUIT, &sa, &sa_old);
}